

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O2

int __thiscall
deqp::BlockSingleNestedStructArrayCase::init
          (BlockSingleNestedStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_> *this_00;
  ShaderInterface *this_01;
  deUint32 dVar1;
  StructType *this_02;
  StructType *this_03;
  UniformBlock *pUVar2;
  VarType VStack_98;
  Uniform local_80;
  VarType local_40;
  
  this_01 = &(this->super_UniformBlockCase).m_interface;
  this_02 = ub::ShaderInterface::allocStruct(this_01,"S");
  ub::VarType::VarType((VarType *)&local_80,TYPE_INT_VEC3,4);
  ub::StructType::addMember(this_02,"a",(VarType *)&local_80,0);
  ub::VarType::~VarType((VarType *)&local_80);
  ub::VarType::VarType(&VStack_98,TYPE_INT_VEC2,2);
  ub::VarType::VarType((VarType *)&local_80,&VStack_98,4);
  ub::StructType::addMember(this_02,"b",(VarType *)&local_80,0);
  ub::VarType::~VarType((VarType *)&local_80);
  ub::VarType::~VarType(&VStack_98);
  ub::VarType::VarType((VarType *)&local_80,TYPE_FLOAT_VEC4,4);
  ub::StructType::addMember(this_02,"c",(VarType *)&local_80,0xc00);
  ub::VarType::~VarType((VarType *)&local_80);
  this_03 = ub::ShaderInterface::allocStruct(this_01,"T");
  ub::VarType::VarType((VarType *)&local_80,TYPE_FLOAT_MAT3,2);
  ub::StructType::addMember(this_03,"a",(VarType *)&local_80,0);
  ub::VarType::~VarType((VarType *)&local_80);
  ub::VarType::VarType(&VStack_98,this_02);
  ub::VarType::VarType((VarType *)&local_80,&VStack_98,3);
  ub::StructType::addMember(this_03,"b",(VarType *)&local_80,0);
  ub::VarType::~VarType((VarType *)&local_80);
  ub::VarType::~VarType(&VStack_98);
  pUVar2 = ub::ShaderInterface::allocBlock(this_01,"Block");
  ub::VarType::VarType(&VStack_98,this_02);
  ub::Uniform::Uniform(&local_80,"s",&VStack_98,0);
  this_00 = &pUVar2->m_uniforms;
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(this_00,&local_80);
  ub::Uniform::~Uniform(&local_80);
  ub::VarType::~VarType(&VStack_98);
  ub::VarType::VarType(&VStack_98,TYPE_FLOAT_VEC2,1);
  ub::Uniform::Uniform(&local_80,"v",&VStack_98,0xc00);
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(this_00,&local_80);
  ub::Uniform::~Uniform(&local_80);
  ub::VarType::~VarType(&VStack_98);
  ub::VarType::VarType(&local_40,this_03);
  ub::VarType::VarType(&VStack_98,&local_40,2);
  ub::Uniform::Uniform(&local_80,"t",&VStack_98,0);
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(this_00,&local_80);
  ub::Uniform::~Uniform(&local_80);
  ub::VarType::~VarType(&VStack_98);
  ub::VarType::~VarType(&local_40);
  ub::VarType::VarType(&VStack_98,TYPE_UINT,4);
  ub::Uniform::Uniform(&local_80,"u",&VStack_98,0);
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(this_00,&local_80);
  ub::Uniform::~Uniform(&local_80);
  ub::VarType::~VarType(&VStack_98);
  dVar1 = this->m_layoutFlags;
  pUVar2->m_flags = dVar1;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::assign((char *)&pUVar2->m_instanceName);
    dVar1 = this->m_numInstances;
    pUVar2->m_arraySize = dVar1;
  }
  return dVar1;
}

Assistant:

void init(void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH);

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM));
		typeT.addMember("b", VarType(VarType(&typeS), 3));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.addUniform(Uniform("v", VarType(glu::TYPE_FLOAT_VEC2, PRECISION_LOW), UNUSED_BOTH));
		block.addUniform(Uniform("t", VarType(VarType(&typeT), 2), 0));
		block.addUniform(Uniform("u", VarType(glu::TYPE_UINT, PRECISION_HIGH), 0));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}